

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIListBox::~CGUIListBox(CGUIListBox *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  code *pcVar2;
  int *piVar3;
  void *pvVar4;
  IGUIScrollBar *pIVar5;
  _func_int *p_Var6;
  IGUIFont *pIVar7;
  IGUISpriteBank *pIVar8;
  pointer pwVar9;
  
  pvVar4 = *vtt;
  *(void **)this = pvVar4;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar4 + -0x18)) = vtt[5];
  pIVar5 = this->ScrollBar;
  if (pIVar5 != (IGUIScrollBar *)0x0) {
    p_Var6 = (pIVar5->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    pcVar2 = p_Var6 + 8 +
             (long)&(pIVar5->super_IGUIElement).Children.
                    super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
    ;
    *(int *)pcVar2 = *(int *)pcVar2 + -1;
    if (*(int *)pcVar2 == 0) {
      (**(code **)(*(long *)(p_Var6 + (long)&(pIVar5->super_IGUIElement).super_IEventReceiver.
                                             _vptr_IEventReceiver) + 8))();
    }
  }
  pIVar7 = this->Font;
  if (pIVar7 != (IGUIFont *)0x0) {
    p_Var6 = pIVar7->_vptr_IGUIFont[-3];
    piVar3 = (int *)(&pIVar7->field_0x10 + (long)p_Var6);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (**(code **)(*(long *)((long)&pIVar7->_vptr_IGUIFont + (long)p_Var6) + 8))();
    }
  }
  pIVar8 = this->IconBank;
  if (pIVar8 != (IGUISpriteBank *)0x0) {
    p_Var6 = pIVar8->_vptr_IGUISpriteBank[-3];
    piVar3 = (int *)(&pIVar8->field_0x10 + (long)p_Var6);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (**(code **)(*(long *)((long)&pIVar8->_vptr_IGUISpriteBank + (long)p_Var6) + 8))();
    }
  }
  pwVar9 = (this->KeyBuffer).str._M_dataplus._M_p;
  paVar1 = &(this->KeyBuffer).str.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar9 != paVar1) {
    operator_delete(pwVar9,paVar1->_M_allocated_capacity * 4 + 4);
  }
  std::vector<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>::
  ~vector(&(this->Items).m_data);
  IGUIElement::~IGUIElement((IGUIElement *)this,vtt + 2);
  return;
}

Assistant:

CGUIListBox::~CGUIListBox()
{
	if (ScrollBar)
		ScrollBar->drop();

	if (Font)
		Font->drop();

	if (IconBank)
		IconBank->drop();
}